

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCommandSetInclusive
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          vectorParams,bool unique,
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          *flags,bool raii,bool raiiFactory,
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          *raiiFlags)

{
  CommandFlavourFlags CVar1;
  size_t initialSkipCount_00;
  MaskType *pMVar2;
  _Base_ptr p_Var3;
  VulkanHppGenerator *this_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *pmVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  string local_b0;
  string *local_90;
  VulkanHppGenerator *local_88;
  size_t local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  _Base_ptr local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enhancedCommands;
  
  local_90 = __return_storage_ptr__;
  local_88 = this;
  local_80 = initialSkipCount;
  if (generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
      ::emptyReturnParams == '\0') {
    generateCommandSetInclusive();
  }
  if (generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
      ::emptyVectorParams == '\0') {
    generateCommandSetInclusive();
  }
  initialSkipCount_00 = local_80;
  if ((undefined1)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color == _S_red) {
    enhancedCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    enhancedCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    enhancedCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniqueCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar2 = *(MaskType **)vectorParams._M_t._M_impl._0_8_;
    local_70 = *(_Base_ptr *)(vectorParams._M_t._M_impl._0_8_ + 8);
    if ((_Base_ptr)pMVar2 != local_70) {
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(CONCAT71(local_78._1_7_,
                              (char)returnParams.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) ^ 1);
      do {
        CVar1.m_mask = *pMVar2;
        if ((CVar1.m_mask & 0x20) != 0 && (char)local_78 == '\0') {
          __assert_fail("!noReturn || !unique",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x11f9,
                        "std::string VulkanHppGenerator::generateCommandSetInclusive(const std::string &, const CommandData &, size_t, bool, std::vector<size_t>, std::map<size_t, VectorParamData>, bool, const std::vector<CommandFlavourFlags> &, bool, bool, const std::vector<CommandFlavourFlags> &) const"
                       );
        }
        pvVar5 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pmVar4 = (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  *)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if ((CVar1.m_mask >> 5 & 1) != 0) {
          pvVar5 = &generateCommandSetInclusive::emptyReturnParams;
          pmVar4 = &generateCommandSetInclusive::emptyVectorParams;
        }
        generateCommandEnhanced
                  (&local_b0,local_88,name,commandData,local_80,definition,pmVar4,pvVar5,CVar1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &enhancedCommands,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((char)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage != '\0') {
          generateCommandEnhanced
                    (&local_b0,local_88,name,commandData,local_80,definition,
                     (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)returnParams.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (CommandFlavourFlags)(CVar1.m_mask | 8));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &uniqueCommands,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        pMVar2 = pMVar2 + 1;
      } while ((_Base_ptr)pMVar2 != local_70);
    }
    this_00 = local_88;
    generateCommandStandard(&local_b0,local_88,name,commandData,local_80,definition);
    generateCommandSet(local_90,this_00,definition,&local_b0,&enhancedCommands,&uniqueCommands);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&uniqueCommands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&enhancedCommands);
  }
  else {
    local_78 = &local_90->field_2;
    (local_90->_M_dataplus)._M_p = (pointer)local_78;
    local_90->_M_string_length = 0;
    (local_90->field_2)._M_local_buf[0] = '\0';
    p_Var3 = *(_Base_ptr *)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_70 = (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_parent;
    if (p_Var3 == local_70) {
      generateRAIIHandleCommandStandard(&local_b0,local_88,name,commandData,local_80,definition);
      generateCommandSetInclusive();
    }
    else {
      do {
        CVar1.m_mask = (MaskType)p_Var3->_M_color;
        if ((CVar1.m_mask & 0x20) != 0 &&
            (char)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == '\x01') {
          __assert_fail("!noReturn || !raiiFactory",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x11e6,
                        "std::string VulkanHppGenerator::generateCommandSetInclusive(const std::string &, const CommandData &, size_t, bool, std::vector<size_t>, std::map<size_t, VectorParamData>, bool, const std::vector<CommandFlavourFlags> &, bool, bool, const std::vector<CommandFlavourFlags> &) const"
                       );
        }
        if ((char)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == '\0') {
          pmVar4 = (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pvVar5 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((CVar1.m_mask >> 5 & 1) != 0) {
            pmVar4 = &generateCommandSetInclusive::emptyVectorParams;
            pvVar5 = &generateCommandSetInclusive::emptyReturnParams;
          }
          generateRAIIHandleCommandEnhanced
                    (&local_b0,local_88,name,commandData,initialSkipCount_00,pvVar5,pmVar4,
                     definition,CVar1);
        }
        else {
          generateRAIIHandleCommandFactory
                    (&local_b0,local_88,name,commandData,initialSkipCount_00,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)returnParams.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish,definition,CVar1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_90,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        p_Var3 = (_Base_ptr)((long)&p_Var3->_M_color + 1);
      } while (p_Var3 != local_70);
    }
  }
  return local_90;
}

Assistant:

std::string VulkanHppGenerator::generateCommandSetInclusive( std::string const &                      name,
                                                             CommandData const &                      commandData,
                                                             size_t                                   initialSkipCount,
                                                             bool                                     definition,
                                                             std::vector<size_t>                      returnParams,
                                                             std::map<size_t, VectorParamData>        vectorParams,
                                                             bool                                     unique,
                                                             std::vector<CommandFlavourFlags> const & flags,
                                                             bool                                     raii,
                                                             bool                                     raiiFactory,
                                                             std::vector<CommandFlavourFlags> const & raiiFlags ) const
{
  static const std::vector<size_t>               emptyReturnParams;
  static const std::map<size_t, VectorParamData> emptyVectorParams;
  if ( raii )
  {
    std::string raiiCommands;
    if ( raiiFlags.empty() )
    {
      // Functions without enhancements need to have a standard implementation
      raiiCommands = generateRAIIHandleCommandStandard( name, commandData, initialSkipCount, definition );
    }
    else
    {
      for ( auto flag : raiiFlags )
      {
        const bool noReturn = flag & CommandFlavourFlagBits::noReturn;
        assert( !noReturn || !raiiFactory );  // noReturn => !raiiFactory
        raiiCommands += raiiFactory ? generateRAIIHandleCommandFactory( name, commandData, initialSkipCount, returnParams, vectorParams, definition, flag )
                                    : generateRAIIHandleCommandEnhanced( name,
                                                                         commandData,
                                                                         initialSkipCount,
                                                                         noReturn ? emptyReturnParams : returnParams,
                                                                         noReturn ? emptyVectorParams : vectorParams,
                                                                         definition,
                                                                         flag );
      }
    }
    return raiiCommands;
  }
  else
  {
    std::vector<std::string> enhancedCommands, uniqueCommands;
    for ( auto flag : flags )
    {
      const bool noReturn = flag & CommandFlavourFlagBits::noReturn;
      assert( !noReturn || !unique );  // noReturn => !unique
      enhancedCommands.push_back( generateCommandEnhanced(
        name, commandData, initialSkipCount, definition, noReturn ? emptyVectorParams : vectorParams, noReturn ? emptyReturnParams : returnParams, flag ) );
      if ( unique )
      {
        uniqueCommands.push_back(
          generateCommandEnhanced( name, commandData, initialSkipCount, definition, vectorParams, returnParams, flag | CommandFlavourFlagBits::unique ) );
      }
    }
    return generateCommandSet( definition, generateCommandStandard( name, commandData, initialSkipCount, definition ), enhancedCommands, uniqueCommands );
  }
}